

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void discrete_dist_test_streamable<trng::binomial_dist>(binomial_dist *d)

{
  StringRef capturedExpression;
  AssertionHandler *this;
  ExprLhs<const_trng::binomial_dist_&> expr;
  binomial_dist *in_RDI;
  AssertionHandler catchAssertionHandler;
  binomial_dist d_new;
  stringstream str;
  param_type p_new;
  param_type *in_stack_fffffffffffffd38;
  binomial_dist *in_stack_fffffffffffffd40;
  AssertionHandler *this_00;
  StringRef *macroName;
  param_type *in_stack_fffffffffffffd58;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffd60;
  binomial_dist *in_stack_fffffffffffffd70;
  ExprLhs<const_trng::binomial_dist_&> *in_stack_fffffffffffffd78;
  param_type *in_stack_fffffffffffffd98;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffda0;
  AssertionHandler local_258 [2];
  stringstream local_1b8 [16];
  StringRef local_1a8 [26];
  binomial_dist *local_8;
  
  local_8 = in_RDI;
  trng::binomial_dist::param_type::param_type((param_type *)0x38858c);
  std::__cxx11::stringstream::stringstream(local_1b8);
  macroName = local_1a8;
  this = (AssertionHandler *)trng::binomial_dist::param(local_8);
  trng::operator<<(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  trng::operator>>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  trng::binomial_dist::binomial_dist(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  local_258[0].m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr((char *)in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38);
  this_00 = local_258;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x127);
  Catch::StringRef::StringRef((StringRef *)this,(char *)macroName);
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffd60;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffd58;
  Catch::AssertionHandler::AssertionHandler
            (this,macroName,(SourceLineInfo *)this_00,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  expr = Catch::Decomposer::operator<=
                   ((Decomposer *)in_stack_fffffffffffffd38,(binomial_dist *)0x388688);
  Catch::ExprLhs<trng::binomial_dist_const&>::operator==
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  Catch::AssertionHandler::handleExpr(this_00,(ITransientExpression *)expr.m_lhs);
  Catch::BinaryExpr<const_trng::binomial_dist_&,_const_trng::binomial_dist_&>::~BinaryExpr
            ((BinaryExpr<const_trng::binomial_dist_&,_const_trng::binomial_dist_&> *)0x3886ce);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  trng::binomial_dist::~binomial_dist((binomial_dist *)0x3887a2);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  trng::binomial_dist::param_type::~param_type((param_type *)0x3887bc);
  return;
}

Assistant:

void discrete_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE(d == d_new);
}